

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashing.c
# Opt level: O3

Hash * compute_run_hash(Hash *__return_storage_ptr__,Hash *exe_hash,PerfProfInput *input,char **args
                       ,int32_t num_args)

{
  BYTE *data;
  size_t len;
  ulong uVar1;
  SHA256_CTX shactx;
  SHA256_CTX local_a0;
  
  if (input != (PerfProfInput *)0x0) {
    sha256_init(&local_a0);
    if (0 < num_args) {
      uVar1 = 0;
      do {
        data = (BYTE *)args[uVar1];
        len = strlen((char *)data);
        sha256_update(&local_a0,data,len);
        uVar1 = uVar1 + 1;
      } while ((uint)num_args != uVar1);
    }
    if (exe_hash != (Hash *)0x0) {
      sha256_update(&local_a0,(BYTE *)exe_hash,0x40);
    }
    sha256_update(&local_a0,&(input->uid).seedidx,1);
    sha256_update(&local_a0,(BYTE *)&(input->uid).hash,0x40);
    __return_storage_ptr__->cstr[0x30] = '\0';
    __return_storage_ptr__->cstr[0x31] = '\0';
    __return_storage_ptr__->cstr[0x32] = '\0';
    __return_storage_ptr__->cstr[0x33] = '\0';
    __return_storage_ptr__->cstr[0x34] = '\0';
    __return_storage_ptr__->cstr[0x35] = '\0';
    __return_storage_ptr__->cstr[0x36] = '\0';
    __return_storage_ptr__->cstr[0x37] = '\0';
    __return_storage_ptr__->cstr[0x38] = '\0';
    __return_storage_ptr__->cstr[0x39] = '\0';
    __return_storage_ptr__->cstr[0x3a] = '\0';
    __return_storage_ptr__->cstr[0x3b] = '\0';
    __return_storage_ptr__->cstr[0x3c] = '\0';
    __return_storage_ptr__->cstr[0x3d] = '\0';
    __return_storage_ptr__->cstr[0x3e] = '\0';
    __return_storage_ptr__->cstr[0x3f] = '\0';
    __return_storage_ptr__->cstr[0x20] = '\0';
    __return_storage_ptr__->cstr[0x21] = '\0';
    __return_storage_ptr__->cstr[0x22] = '\0';
    __return_storage_ptr__->cstr[0x23] = '\0';
    __return_storage_ptr__->cstr[0x24] = '\0';
    __return_storage_ptr__->cstr[0x25] = '\0';
    __return_storage_ptr__->cstr[0x26] = '\0';
    __return_storage_ptr__->cstr[0x27] = '\0';
    __return_storage_ptr__->cstr[0x28] = '\0';
    __return_storage_ptr__->cstr[0x29] = '\0';
    __return_storage_ptr__->cstr[0x2a] = '\0';
    __return_storage_ptr__->cstr[0x2b] = '\0';
    __return_storage_ptr__->cstr[0x2c] = '\0';
    __return_storage_ptr__->cstr[0x2d] = '\0';
    __return_storage_ptr__->cstr[0x2e] = '\0';
    __return_storage_ptr__->cstr[0x2f] = '\0';
    __return_storage_ptr__->cstr[0x10] = '\0';
    __return_storage_ptr__->cstr[0x11] = '\0';
    __return_storage_ptr__->cstr[0x12] = '\0';
    __return_storage_ptr__->cstr[0x13] = '\0';
    __return_storage_ptr__->cstr[0x14] = '\0';
    __return_storage_ptr__->cstr[0x15] = '\0';
    __return_storage_ptr__->cstr[0x16] = '\0';
    __return_storage_ptr__->cstr[0x17] = '\0';
    __return_storage_ptr__->cstr[0x18] = '\0';
    __return_storage_ptr__->cstr[0x19] = '\0';
    __return_storage_ptr__->cstr[0x1a] = '\0';
    __return_storage_ptr__->cstr[0x1b] = '\0';
    __return_storage_ptr__->cstr[0x1c] = '\0';
    __return_storage_ptr__->cstr[0x1d] = '\0';
    __return_storage_ptr__->cstr[0x1e] = '\0';
    __return_storage_ptr__->cstr[0x1f] = '\0';
    __return_storage_ptr__->cstr[0] = '\0';
    __return_storage_ptr__->cstr[1] = '\0';
    __return_storage_ptr__->cstr[2] = '\0';
    __return_storage_ptr__->cstr[3] = '\0';
    __return_storage_ptr__->cstr[4] = '\0';
    __return_storage_ptr__->cstr[5] = '\0';
    __return_storage_ptr__->cstr[6] = '\0';
    __return_storage_ptr__->cstr[7] = '\0';
    __return_storage_ptr__->cstr[8] = '\0';
    __return_storage_ptr__->cstr[9] = '\0';
    __return_storage_ptr__->cstr[10] = '\0';
    __return_storage_ptr__->cstr[0xb] = '\0';
    __return_storage_ptr__->cstr[0xc] = '\0';
    __return_storage_ptr__->cstr[0xd] = '\0';
    __return_storage_ptr__->cstr[0xe] = '\0';
    __return_storage_ptr__->cstr[0xf] = '\0';
    __return_storage_ptr__->cstr[0x40] = '\0';
    sha256_finalize_to_cstr(&local_a0,__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  __assert_fail("input",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/hashing.c"
                ,0x5a,"Hash compute_run_hash(const Hash *, const PerfProfInput *, char **, int32_t)"
               );
}

Assistant:

Hash compute_run_hash(const Hash *exe_hash, const PerfProfInput *input,
                      char *args[PROC_MAX_ARGS], int32_t num_args) {
    assert(input);

    SHA256_CTX shactx;
    sha256_init(&shactx);

    for (int32_t i = 0; i < num_args; i++) {
        sha256_update(&shactx, (const BYTE *)(&args[i][0]), strlen(args[i]));
    }

    if (exe_hash) {
        sha256_update(&shactx, (const BYTE *)(&exe_hash->cstr[0]), 64);
    }

    sha256_update(&shactx, (const BYTE *)(&input->uid.seedidx),
                  sizeof(input->uid.seedidx));
    sha256_update(&shactx, (const BYTE *)(&input->uid.hash.cstr[0]), 64);

    Hash result = {0};
    sha256_finalize_to_cstr(&shactx, &result);
    return result;
}